

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

void __thiscall spvtools::opt::LoopPeeling::GetIteratingExitValues(LoopPeeling *this)

{
  IRContext *this_00;
  CFG *pCVar1;
  bool bVar2;
  uint32_t uVar3;
  BasicBlock *pBVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  Function *f;
  DominatorAnalysis *this_01;
  anon_class_24_3_7bd34285 local_f8;
  function<void_(spvtools::opt::Instruction_*)> local_e0;
  BasicBlock *local_c0;
  BasicBlock *condition_block;
  DominatorTree *dom_tree;
  DefUseManager *local_a8;
  LoopPeeling *local_a0;
  function<void_(spvtools::opt::Instruction_*)> local_98;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  uint *local_70;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *header_pred;
  DefUseManager *pDStack_48;
  uint32_t condition_block_id;
  DefUseManager *def_use_mgr;
  function<void_(spvtools::opt::Instruction_*)> local_38;
  CFG *local_18;
  CFG *cfg;
  LoopPeeling *this_local;
  
  cfg = (CFG *)this;
  local_18 = IRContext::cfg(this->context_);
  pBVar4 = Loop::GetHeaderBlock(this->loop_);
  def_use_mgr = (DefUseManager *)this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::LoopPeeling::GetIteratingExitValues()::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_38,
             (anon_class_8_1_8991fb9c *)&def_use_mgr);
  BasicBlock::ForEachPhiInst(pBVar4,&local_38,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_38);
  pBVar4 = Loop::GetMergeBlock(this->loop_);
  pCVar1 = local_18;
  if (pBVar4 != (BasicBlock *)0x0) {
    pBVar4 = Loop::GetMergeBlock(this->loop_);
    uVar3 = BasicBlock::id(pBVar4);
    pvVar5 = CFG::preds(pCVar1,uVar3);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
    if (sVar6 == 1) {
      pDStack_48 = IRContext::get_def_use_mgr(this->context_);
      pCVar1 = local_18;
      pBVar4 = Loop::GetMergeBlock(this->loop_);
      uVar3 = BasicBlock::id(pBVar4);
      pvVar5 = CFG::preds(pCVar1,uVar3);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar5,0);
      pCVar1 = local_18;
      header_pred._4_4_ = *pvVar7;
      pBVar4 = Loop::GetHeaderBlock(this->loop_);
      uVar3 = BasicBlock::id(pBVar4);
      local_58 = CFG::preds(pCVar1,uVar3);
      local_68._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(local_58);
      local_70 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(local_58);
      local_60 = std::
                 find<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                           (local_68,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                      )local_70,(uint *)((long)&header_pred + 4));
      local_78._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(local_58);
      bVar2 = __gnu_cxx::operator!=(&local_60,&local_78);
      this->do_while_form_ = bVar2;
      if ((this->do_while_form_ & 1U) == 0) {
        this_00 = this->context_;
        f = LoopUtils::GetFunction(&this->loop_utils_);
        this_01 = IRContext::GetDominatorAnalysis(this_00,f);
        condition_block =
             (BasicBlock *)DominatorAnalysisBase::GetDomTree(&this_01->super_DominatorAnalysisBase);
        local_c0 = CFG::block(local_18,header_pred._4_4_);
        pBVar4 = Loop::GetHeaderBlock(this->loop_);
        local_f8.dom_tree = (DominatorTree *)condition_block;
        local_f8.condition_block = local_c0;
        local_f8.this = this;
        std::function<void(spvtools::opt::Instruction*)>::
        function<spvtools::opt::LoopPeeling::GetIteratingExitValues()::__2,void>
                  ((function<void(spvtools::opt::Instruction*)> *)&local_e0,&local_f8);
        BasicBlock::ForEachPhiInst(pBVar4,&local_e0,false);
        std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_e0);
      }
      else {
        pBVar4 = Loop::GetHeaderBlock(this->loop_);
        dom_tree._0_4_ = header_pred._4_4_;
        local_a8 = pDStack_48;
        local_a0 = this;
        std::function<void(spvtools::opt::Instruction*)>::
        function<spvtools::opt::LoopPeeling::GetIteratingExitValues()::__1,void>
                  ((function<void(spvtools::opt::Instruction*)> *)&local_98,
                   (anon_class_24_3_b03964de *)&dom_tree);
        BasicBlock::ForEachPhiInst(pBVar4,&local_98,false);
        std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_98);
      }
    }
  }
  return;
}

Assistant:

void LoopPeeling::GetIteratingExitValues() {
  CFG& cfg = *context_->cfg();

  loop_->GetHeaderBlock()->ForEachPhiInst(
      [this](Instruction* phi) { exit_value_[phi->result_id()] = nullptr; });

  if (!loop_->GetMergeBlock()) {
    return;
  }
  if (cfg.preds(loop_->GetMergeBlock()->id()).size() != 1) {
    return;
  }
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  uint32_t condition_block_id = cfg.preds(loop_->GetMergeBlock()->id())[0];

  auto& header_pred = cfg.preds(loop_->GetHeaderBlock()->id());
  do_while_form_ = std::find(header_pred.begin(), header_pred.end(),
                             condition_block_id) != header_pred.end();
  if (do_while_form_) {
    loop_->GetHeaderBlock()->ForEachPhiInst(
        [condition_block_id, def_use_mgr, this](Instruction* phi) {
          std::unordered_set<Instruction*> operations;

          for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
            if (condition_block_id == phi->GetSingleWordInOperand(i + 1)) {
              exit_value_[phi->result_id()] =
                  def_use_mgr->GetDef(phi->GetSingleWordInOperand(i));
            }
          }
        });
  } else {
    DominatorTree* dom_tree =
        &context_->GetDominatorAnalysis(loop_utils_.GetFunction())
             ->GetDomTree();
    BasicBlock* condition_block = cfg.block(condition_block_id);

    loop_->GetHeaderBlock()->ForEachPhiInst(
        [dom_tree, condition_block, this](Instruction* phi) {
          std::unordered_set<Instruction*> operations;

          // Not the back-edge value, check if the phi instruction is the only
          // possible candidate.
          GetIteratorUpdateOperations(loop_, phi, &operations);

          for (Instruction* insn : operations) {
            if (insn == phi) {
              continue;
            }
            if (dom_tree->Dominates(context_->get_instr_block(insn),
                                    condition_block)) {
              return;
            }
          }
          exit_value_[phi->result_id()] = phi;
        });
  }
}